

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O3

void __thiscall
deqp::gls::ProgramContext::ProgramContext
          (ProgramContext *this,char *vtxShaderSource_,char *fragShaderSource_,
          char *positionAttrName_)

{
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,vtxShaderSource_,&local_21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->fragmentSource,fragShaderSource_,&local_22);
  (this->textureSpecs).
  super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textureSpecs).
  super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uniforms).super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uniforms).super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->attributes).super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uniforms).super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->textureSpecs).
  super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->positionAttrName,positionAttrName_,&local_23);
  return;
}

Assistant:

ProgramContext (const char* const vtxShaderSource_,
					const char* const fragShaderSource_,
					const char* const positionAttrName_)
		: vertexSource		(vtxShaderSource_)
		, fragmentSource	(fragShaderSource_)
		, positionAttrName	(positionAttrName_)
	{
	}